

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O1

mk_list * mk_server_listen_init(mk_server *server)

{
  char cVar1;
  mk_list *pmVar2;
  int sockfd;
  int iVar3;
  mk_list *__pointer;
  int *piVar4;
  mk_sched_handler *pmVar5;
  mk_plugin *pmVar6;
  char *format;
  mk_list *pmVar7;
  
  if (server == (mk_server *)0x0) {
    __pointer = (mk_list *)0x0;
  }
  else {
    __pointer = (mk_list *)malloc(0x10);
    if (__pointer == (mk_list *)0x0) {
      perror("malloc");
    }
    __pointer->next = __pointer;
    __pointer->prev = __pointer;
    cVar1 = server->scheduler_mode;
    pmVar7 = (server->listeners).next;
    if (pmVar7 != &server->listeners) {
      do {
        sockfd = mk_socket_server((char *)pmVar7[-1].prev,(char *)pmVar7[-2].next,
                                  (uint)(cVar1 == '\x01'),server);
        if (sockfd < 0) {
          mk_print(0x1001,"[server] Failed to bind server socket to %s:%s.",pmVar7[-2].next,
                   pmVar7[-1].prev);
          return (mk_list *)0x0;
        }
        iVar3 = mk_socket_set_tcp_defer_accept(sockfd);
        if (iVar3 != 0) {
          mk_print(0x1002,"[server] Could not set TCP_DEFER_ACCEPT");
        }
        piVar4 = (int *)calloc(1,0x78);
        *piVar4 = sockfd;
        piVar4[1] = 1;
        piVar4[2] = 0;
        *(undefined1 *)(piVar4 + 3) = 1;
        piVar4[0x12] = sockfd;
        *(mk_list ***)(piVar4 + 0x18) = &pmVar7[-2].next;
        if (((ulong)pmVar7[-1].next & 1) != 0) {
          pmVar5 = mk_sched_handler_cap('\x01');
          if (pmVar5 == (mk_sched_handler *)0x0) {
            format = "HTTP protocol not supported";
            goto LAB_0010f4be;
          }
          *(mk_sched_handler **)(piVar4 + 0x16) = pmVar5;
        }
        pmVar6 = mk_plugin_cap('\x04',server);
        *(mk_plugin **)(piVar4 + 0x14) = pmVar6;
        if (((ulong)pmVar7[-1].next & 8) != 0) {
          pmVar6 = mk_plugin_cap('\b',server);
          if (pmVar6 == (mk_plugin *)0x0) {
            format = "SSL/TLS not supported";
LAB_0010f4be:
            mk_print(0x1001,format);
            exit(1);
          }
          *(mk_plugin **)(piVar4 + 0x14) = pmVar6;
        }
        pmVar2 = __pointer->prev;
        __pointer->prev = (mk_list *)(piVar4 + 0x1a);
        *(mk_list **)(piVar4 + 0x1c) = __pointer;
        *(mk_list **)(piVar4 + 0x1a) = pmVar2;
        pmVar2->next = (mk_list *)(piVar4 + 0x1a);
        pmVar7 = pmVar7->next;
      } while (pmVar7 != &server->listeners);
    }
    if (cVar1 == '\x01') {
      pthread_setspecific(mk_tls_server_listen,__pointer);
    }
  }
  return __pointer;
}

Assistant:

struct mk_list *mk_server_listen_init(struct mk_server *server)
{
    int server_fd;
    int reuse_port = MK_FALSE;
    struct mk_list *head;
    struct mk_list *listeners;
    struct mk_event *event;
    struct mk_server_listen *listener;
    struct mk_sched_handler *protocol;
    struct mk_plugin *plugin;
    struct mk_config_listener *listen;

    if (!server) {
        goto error;
    }

    listeners = mk_mem_alloc(sizeof(struct mk_list));
    mk_list_init(listeners);

    if (server->scheduler_mode == MK_SCHEDULER_REUSEPORT) {
        reuse_port = MK_TRUE;
    }

    mk_list_foreach(head, &server->listeners) {
        listen = mk_list_entry(head, struct mk_config_listener, _head);

        server_fd = mk_socket_server(listen->port,
                                     listen->address,
                                     reuse_port,
                                     server);
        if (server_fd >= 0) {
            if (mk_socket_set_tcp_defer_accept(server_fd) != 0) {
#if defined (__linux__)
                mk_warn("[server] Could not set TCP_DEFER_ACCEPT");
#endif
            }

            listener = mk_mem_alloc_z(sizeof(struct mk_server_listen));

            /* configure the internal event_state */
            event = &listener->event;
            event->fd   = server_fd;
            event->type = MK_EVENT_LISTENER;
            event->mask = MK_EVENT_EMPTY;
            event->status = MK_EVENT_NONE;

            /* continue with listener setup and linking */
            listener->server_fd = server_fd;
            listener->listen    = listen;

            if (listen->flags & MK_CAP_HTTP) {
                protocol = mk_sched_handler_cap(MK_CAP_HTTP);
                if (!protocol) {
                    mk_err("HTTP protocol not supported");
                    exit(EXIT_FAILURE);
                }
                listener->protocol = protocol;
            }

#ifdef MK_HAVE_HTTP2
            if (listen->flags & MK_CAP_HTTP2) {
                protocol = mk_sched_handler_cap(MK_CAP_HTTP2);
                if (!protocol) {
                    mk_err("HTTP2 protocol not supported");
                    exit(EXIT_FAILURE);
                }
                listener->protocol = protocol;
            }
#endif
            listener->network = mk_plugin_cap(MK_CAP_SOCK_PLAIN, server);

            if (listen->flags & MK_CAP_SOCK_TLS) {
                plugin = mk_plugin_cap(MK_CAP_SOCK_TLS, server);
                if (!plugin) {
                    mk_err("SSL/TLS not supported");
                    exit(EXIT_FAILURE);
                }
                listener->network = plugin;
            }

            mk_list_add(&listener->_head, listeners);
        }
        else {
            mk_err("[server] Failed to bind server socket to %s:%s.",
                   listen->address,
                   listen->port);
            return NULL;
        }
    }

    if (reuse_port == MK_TRUE) {
        MK_TLS_SET(mk_tls_server_listen, listeners);
    }

    return listeners;

error:
    return NULL;
}